

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O1

bool __thiscall Nibbler::skipAll(Nibbler *this,char c)

{
  size_type sVar1;
  bool bVar2;
  
  if (this->_cursor < this->_length) {
    sVar1 = std::__cxx11::string::find_first_not_of((char)this,(ulong)(uint)(int)c);
    bVar2 = sVar1 != this->_cursor;
    if (bVar2) {
      if (sVar1 == 0xffffffffffffffff) {
        sVar1 = this->_length;
      }
      this->_cursor = sVar1;
      bVar2 = true;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Nibbler::skipAll (char c)
{
  if (_cursor < _length)
  {
    std::string::size_type i = _input.find_first_not_of (c, _cursor);
    if (i == _cursor)
      return false;

    if (i == std::string::npos)
      _cursor = _length;  // Yes, off the end.
    else
      _cursor = i;

    return true;
  }

  return false;
}